

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O1

bool __thiscall
ser::OffsetTable::AlreadySerialized
          (OffsetTable *this,string *fieldName,string *checksum,offset_t *offset)

{
  _Base_ptr __n;
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
  *p_Var4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
  *this_00;
  bool bVar5;
  
  p_Var4 = &((this->entries_).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  bVar5 = p_Var4 != &((this->entries_).
                      super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  if (bVar5) {
    do {
      this_00 = p_Var4 + -1;
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
              ::find(this_00,fieldName);
      if (&(((_Rep_type *)&p_Var4[-1]._M_impl)->_M_impl).super__Rb_tree_header ==
          (_Rb_tree_header *)cVar3._M_node) {
        bVar1 = false;
      }
      else {
        __n = cVar3._M_node[2]._M_left;
        bVar1 = false;
        if ((__n == (_Base_ptr)checksum->_M_string_length) &&
           ((__n == (_Base_ptr)0x0 ||
            (iVar2 = bcmp(cVar3._M_node[2]._M_parent,(checksum->_M_dataplus)._M_p,(size_t)__n),
            iVar2 == 0)))) {
          *offset = *(offset_t *)(cVar3._M_node + 2);
          bVar1 = true;
        }
      }
    } while ((!bVar1) &&
            (bVar5 = this_00 !=
                     &((this->entries_).
                       super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t, p_Var4 = this_00, bVar5));
  }
  return bVar5;
}

Assistant:

bool OffsetTable::AlreadySerialized(const std::string& fieldName, const std::string& checksum, OffsetTable::offset_t& offset) const
{
    // Loop backwards
    for (std::vector<OffsetTableEntry>::const_reverse_iterator iter = entries_.rbegin(); iter != entries_.rend(); ++iter)
    {
        OffsetTableEntry::const_iterator entry = iter->find(fieldName);
        if (entry == iter->end())
            continue;
        if (entry->second.checksum == checksum)
        {
            offset = entry->second.offset;
            return true;
        }
    }
    return false;
}